

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid2d_refinement_pattern.cc
# Opt level: O3

size_type __thiscall
lf::refinement::Hybrid2DRefinementPattern::NumChildren(Hybrid2DRefinementPattern *this,dim_t codim)

{
  RefEl *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  dim_t dVar2;
  ulong uVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  undefined *puVar6;
  bool bVar7;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  this_00 = &(this->super_RefinementPattern).ref_el_;
  dVar2 = base::internal::DimensionImpl((this->super_RefinementPattern).ref_el_.type_);
  if (dVar2 < codim) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"Illegal codim = ",0x10);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," for ",5);
    base::RefEl::ToString_abi_cxx11_(&local_208,this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,local_208._M_dataplus._M_p,local_208._M_string_length);
    paVar1 = &local_208.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    local_208._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"codim <= ref_el_.Dimension()","");
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_208,&local_1e8,0x34,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"this code should not be reached");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  switch(this_00->type_) {
  case kPoint:
    if (this->ref_pat_ < rp_split) {
      return this->ref_pat_;
    }
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"Illegal refinement pattern for point",0x24);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_208,&local_1e8,0x40,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"this code should not be reached");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case kSegment:
    if (codim != 1) {
      if (codim != 0) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"invalid codim",0xd);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_208,&local_1e8,0x6e,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (this->ref_pat_ < rp_bisect) {
        return this->ref_pat_;
      }
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"refinement pattern ",0x13);
      poVar4 = (ostream *)std::ostream::operator<<(local_198,this->ref_pat_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"not implemented for edge!",0x19);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_208,&local_1e8,0x55,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"this code should not be reached");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar3 = (ulong)this->ref_pat_;
    if (2 < uVar3) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"refinement pattern ",0x13);
      poVar4 = (ostream *)std::ostream::operator<<(local_198,this->ref_pat_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"not implemented for edge!",0x19);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_208,&local_1e8,0x67,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"this code should not be reached");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    puVar6 = &DAT_00375fcc;
    break;
  case kTria:
    if (codim == 2) {
      bVar7 = this->ref_pat_ == rp_barycentric;
LAB_002c0193:
      return (uint)bVar7;
    }
    if (codim == 1) {
      uVar3 = (ulong)this->ref_pat_;
      if ((9 < uVar3) || ((0x37bU >> (this->ref_pat_ & 0x1f) & 1) == 0)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"refinement pattern ",0x13);
        operator<<(local_198,&this->ref_pat_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_198,"not implemented for triangle!",0x1d);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_208,&local_1e8,0xac,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar6 = &DAT_00376000;
    }
    else {
      if (codim != 0) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"invalid codim",0xd);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_208,&local_1e8,0x93,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar3 = (ulong)this->ref_pat_;
      if ((9 < uVar3) || ((0x37bU >> (this->ref_pat_ & 0x1f) & 1) == 0)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"refinement pattern ",0x13);
        poVar4 = (ostream *)std::ostream::operator<<(local_198,this->ref_pat_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"not implemented for triangle!",0x1d);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_208,&local_1e8,0x8d,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar6 = &DAT_00375fd8;
    }
    break;
  case kQuad:
    if (codim == 2) {
      bVar7 = (this->ref_pat_ & ~rp_copy) == rp_regular;
      goto LAB_002c0193;
    }
    if (codim == 1) {
      uVar3 = (ulong)this->ref_pat_;
      if ((9 < uVar3) || ((0x3dfU >> (this->ref_pat_ & 0x1f) & 1) == 0)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"refinement pattern ",0x13);
        poVar4 = (ostream *)std::ostream::operator<<(local_198,this->ref_pat_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"not implemented for quadrilateral!",0x22);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_208,&local_1e8,0xf7,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar6 = &DAT_00376050;
    }
    else {
      if (codim != 0) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"invalid codim",0xd);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_208,&local_1e8,0x106,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar3 = (ulong)this->ref_pat_;
      if ((9 < uVar3) || ((0x3dfU >> (this->ref_pat_ & 0x1f) & 1) == 0)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"refinement pattern ",0x13);
        operator<<(local_198,&this->ref_pat_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_198,"not implemented for quadrilateral!",0x22);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_208,&local_1e8,0xd7,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar6 = &DAT_00376028;
    }
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"unsupported RefEl",0x11);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/hybrid2d_refinement_pattern.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_208,&local_1e8,0x10b,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"this code should not be reached");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return *(size_type *)(puVar6 + uVar3 * 4);
}

Assistant:

lf::base::size_type Hybrid2DRefinementPattern::NumChildren(
    lf::base::dim_t codim) const {
  LF_VERIFY_MSG(codim <= ref_el_.Dimension(),
                "Illegal codim = " << codim << " for " << ref_el_.ToString());
  // Depending on the type of cell do something different
  switch (ref_el_) {
    case lf::base::RefEl::kPoint(): {
      switch (ref_pat_) {
        case RefPat::rp_nil: {
          return 0;
        }
        case RefPat::rp_copy: {
          return 1;
        }
        default: {
          LF_VERIFY_MSG(false, "Illegal refinement pattern for point");
        }
      }  // end swtich ref_pat
      break;
    }  // end case of a simple point
    case lf::base::RefEl::kSegment(): {
      switch (codim) {
        case 0: {
          switch (ref_pat_) {
            case RefPat::rp_nil: {
              return 0;
            }
            case RefPat::rp_copy: {
              return 1;
            }
            case RefPat::rp_split: {
              return 2;
            }
            default: {
              LF_VERIFY_MSG(false, "refinement pattern "
                                       << (int)ref_pat_
                                       << "not implemented for edge!");
              break;
            }
          }  // end switch ref_pat
          break;
        }
        case 1: {
          switch (ref_pat_) {
            case RefPat::rp_nil:
            case RefPat::rp_copy: {
              return 0;
            }
            case RefPat::rp_split: {
              return 1;
            }
            default: {
              LF_VERIFY_MSG(false, "refinement pattern "
                                       << (int)ref_pat_
                                       << "not implemented for edge!");
              break;
            }
          }  // end switch ref_pat
          break;
        }
        default:
          LF_VERIFY_MSG(false, "invalid codim");
      }  // end switch codim
      break;
    }  // end case of an edge
    case lf::base::RefEl::kTria(): {
      switch (codim) {
        case 0: {
          switch (ref_pat_) {
            case RefPat::rp_nil: {
              return 0;
            }
            case RefPat::rp_copy: {
              return 1;
            }
            case RefPat::rp_bisect: {
              return 2;
            }
            case RefPat::rp_trisect:
            case RefPat::rp_trisect_left: {
              return 3;
            }
            case RefPat::rp_quadsect:
            case RefPat::rp_regular: {
              return 4;
            }
            case RefPat::rp_barycentric: {
              return 6;
            }
            default: {
              LF_VERIFY_MSG(false, "refinement pattern "
                                       << (int)ref_pat_
                                       << "not implemented for triangle!");
              break;
            }
          }  // end switch ref_pat
          break;
          default:
            LF_VERIFY_MSG(false, "invalid codim");
        }  // end case codim = 0
        case 1: {
          switch (ref_pat_) {
            case RefPat::rp_nil:
            case RefPat::rp_copy: {
              return 0;
            }
            case RefPat::rp_bisect: {
              return 1;
            }
            case RefPat::rp_trisect:
            case RefPat::rp_trisect_left: {
              return 2;
            }
            case RefPat::rp_quadsect:
            case RefPat::rp_regular: {
              return 3;
            }
            case RefPat::rp_barycentric: {
              return 6;
            }
            default: {
              LF_VERIFY_MSG(false, "refinement pattern "
                                       << ref_pat_
                                       << "not implemented for triangle!");
              break;
            }
          }  // end switch ref_pat
          break;
        }  // end case codim = 1
        case 2: {
          if (ref_pat_ == RefPat::rp_barycentric) {
            return 1;
          }
          return 0;
        }
      }  // end switch codim
      break;
    }  // end case of a triangle
    case lf::base::RefEl::kQuad(): {
      switch (codim) {
        case 0: {
          switch (ref_pat_) {
            case RefPat::rp_nil: {
              return 0;
            }
            case RefPat::rp_copy: {
              return 1;
            }
            case RefPat::rp_trisect: {
              return 3;
            }
            case RefPat::rp_quadsect: {
              return 4;
            }
            case RefPat::rp_bisect:
            case RefPat::rp_split: {
              return 2;
            }
            case RefPat::rp_threeedge:
            case RefPat::rp_barycentric:
            case RefPat::rp_regular: {
              return 4;
            }
            default: {
              LF_VERIFY_MSG(false, "refinement pattern "
                                       << ref_pat_
                                       << "not implemented for quadrilateral!");
              break;
            }
          }  // end switch ref_pat
          break;
        }
        case 1: {
          switch (ref_pat_) {
            case RefPat::rp_nil:
            case RefPat::rp_copy: {
              return 0;
            }
            case RefPat::rp_trisect: {
              return 2;
            }
            case RefPat::rp_quadsect: {
              return 3;
            }
            case RefPat::rp_bisect:
            case RefPat::rp_split: {
              return 1;
            }
            case RefPat::rp_threeedge: {
              return 3;
            }
            case RefPat::rp_barycentric:
            case RefPat::rp_regular: {
              return 4;
            }
            default: {
              LF_VERIFY_MSG(false, "refinement pattern "
                                       << (int)ref_pat_
                                       << "not implemented for quadrilateral!");
              break;
            }
          }  // end switch ref_pat
          break;
        }
        case 2: {
          if ((ref_pat_ == RefPat::rp_barycentric) ||
              (ref_pat_ == RefPat::rp_regular)) {
            return 1;
          }
          return 0;
          break;
        }
        default:
          LF_VERIFY_MSG(false, "invalid codim");
      }  // end switch codim
      break;
    }  // end case of a quadrilateral
    default:
      LF_VERIFY_MSG(false, "unsupported RefEl");
  }  // end switch cell type
  return 0;
}